

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O0

void __thiscall GF2::VFunc<7UL,_8UL>::VFunc(VFunc<7UL,_8UL> *this,word valRight)

{
  WW<8UL> *in_RDI;
  Func<7UL,_GF2::WW<8UL>_> *unaff_retaddr;
  word in_stack_ffffffffffffffd8;
  
  WW<8UL>::WW(in_RDI,in_stack_ffffffffffffffd8);
  Func<7UL,_GF2::WW<8UL>_>::Func(unaff_retaddr,in_RDI);
  return;
}

Assistant:

VFunc(word valRight = 0) : Func<_n, Image>(WW<_m>(valRight)) {}